

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void PartialCRCBitByBitTest<unsigned_short,(unsigned_short)16>
               (char *data,size_t size,Parameters<unsigned_short,_(unsigned_short)16> *parameters,
               unsigned_short expectedCRC,string *crcName)

{
  char cVar1;
  char cVar2;
  unsigned_short reversedValue_4;
  uint uVar3;
  char *pcVar4;
  unsigned_short computedCRC;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  unsigned_short reversedValue;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  unsigned_short reversedValue_3;
  short sVar11;
  long lVar12;
  long lVar13;
  bool in_stack_00000008;
  
  uVar3 = (uint)*(ushort *)data;
  uVar5 = (uint)*(ushort *)(data + 2);
  cVar1 = data[6];
  if (cVar1 == '\0') {
    pcVar4 = "123456789";
    lVar12 = 4;
    do {
      uVar5 = uVar5 ^ (uint)(byte)*pcVar4 << 8;
      lVar13 = 8;
      do {
        uVar5 = (int)(short)uVar5 >> 0xf & uVar3 ^ uVar5 * 2;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      pcVar4 = (char *)((byte *)pcVar4 + 1);
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  else {
    sVar11 = 0x10;
    uVar8 = 0;
    do {
      uVar8 = (uVar3 & 1) + uVar8 * 2;
      uVar3 = uVar3 >> 1;
      sVar11 = sVar11 + -1;
    } while (sVar11 != 0);
    pcVar4 = "123456789";
    lVar12 = 4;
    do {
      uVar5 = uVar5 ^ (byte)*pcVar4;
      lVar13 = 8;
      do {
        uVar5 = (uVar5 & 0xffff) >> 1 ^ -(uVar5 & 1) & uVar8;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      pcVar4 = (char *)((byte *)pcVar4 + 1);
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  cVar2 = data[7];
  if (cVar1 == cVar2) {
    uVar7 = (ulong)uVar5;
  }
  else {
    sVar11 = 0x10;
    uVar7 = 0;
    do {
      uVar7 = (ulong)((uVar5 & 1) + (int)uVar7 * 2);
      uVar5 = (uVar5 & 0xffff) >> 1;
      sVar11 = sVar11 + -1;
    } while (sVar11 != 0);
  }
  if (cVar1 != cVar2) {
    sVar11 = 0x10;
    uVar6 = 0;
    uVar9 = uVar7;
    do {
      uVar7 = (ulong)(((uint)uVar9 & 1) + (int)uVar6 * 2);
      uVar9 = (uVar9 & 0xffff) >> 1;
      sVar11 = sVar11 + -1;
      uVar6 = uVar7;
    } while (sVar11 != 0);
  }
  uVar3 = (uint)*(ushort *)data;
  if (cVar1 == '\0') {
    pbVar10 = (byte *)0x104008;
    lVar12 = 5;
    do {
      uVar7 = (ulong)((uint)uVar7 ^ (uint)*pbVar10 << 8);
      lVar13 = 8;
      do {
        uVar7 = (ulong)((int)(short)uVar7 >> 0xf & uVar3 ^ (int)uVar7 * 2);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      pbVar10 = pbVar10 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  else {
    sVar11 = 0x10;
    uVar5 = 0;
    do {
      uVar5 = (uVar3 & 1) + uVar5 * 2;
      uVar3 = uVar3 >> 1;
      sVar11 = sVar11 + -1;
    } while (sVar11 != 0);
    pbVar10 = (byte *)0x104008;
    lVar12 = 5;
    do {
      uVar7 = (ulong)((uint)uVar7 ^ (uint)*pbVar10);
      lVar13 = 8;
      do {
        uVar7 = (ulong)((uint)((uVar7 & 0xffff) >> 1) ^ -((uint)uVar7 & 1) & uVar5);
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      pbVar10 = pbVar10 + 1;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
  }
  computedCRC = (unsigned_short)uVar7;
  if (cVar1 == cVar2) {
    uVar3 = (uint)uVar7;
  }
  else {
    sVar11 = 0x10;
    uVar3 = 0;
    do {
      uVar3 = ((uint)uVar7 & 1) + uVar3 * 2;
      uVar7 = (uVar7 & 0xffff) >> 1;
      computedCRC = (unsigned_short)uVar7;
      sVar11 = sVar11 + -1;
    } while (sVar11 != 0);
  }
  PrintResult<unsigned_short,(unsigned_short)16>
            (data,size & 0xffff,
             (Parameters<unsigned_short,_(unsigned_short)16> *)
             (ulong)((uVar3 ^ *(ushort *)(data + 4)) & 0xffff),(unsigned_short)parameters,
             computedCRC,(string *)(ulong)*(ushort *)(data + 4),in_stack_00000008);
  return;
}

Assistant:

static void PartialCRCBitByBitTest(const char * data, size_t size, const CRC::Parameters<CRCType, CRCWidth> & parameters, CRCType expectedCRC, const std::string & crcName)
{
    CRCType computedCRC = CRC::Calculate(data, size / 2, parameters);

    // Don't forget (size + 1) to round odd numbers properly!
    computedCRC = CRC::Calculate(data + (size / 2), (size + 1) / 2, parameters, computedCRC);

    PrintResult<CRCType, CRCWidth>(data, size, parameters, expectedCRC, computedCRC, crcName, true);
}